

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.h
# Opt level: O0

_vector3<double> * __thiscall
xray_re::_vector3<double>::cross_product(_vector3<double> *this,_vector3<double> *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double _y;
  double _x;
  _vector3<double> *v_local;
  _vector3<double> *this_local;
  
  dVar1 = (v->field_0).field_0.z;
  dVar2 = (this->field_0).field_0.z;
  dVar3 = (v->field_0).field_0.y;
  dVar4 = (this->field_0).field_0.z;
  dVar5 = (v->field_0).field_0.x;
  dVar6 = (this->field_0).field_0.x;
  dVar7 = (v->field_0).field_0.z;
  (this->field_0).field_0.z =
       (this->field_0).field_0.x * (v->field_0).field_0.y +
       -((this->field_0).field_0.y * (v->field_0).field_0.x);
  (this->field_0).field_0.x = (this->field_0).field_0.y * dVar1 + -(dVar2 * dVar3);
  (this->field_0).field_0.y = dVar4 * dVar5 + -(dVar6 * dVar7);
  return this;
}

Assistant:

inline _vector3<T>& _vector3<T>::cross_product(const _vector3<T>& v)
{
	T _x = y*v.z - z*v.y;
	T _y = z*v.x - x*v.z;
	z = x*v.y - y*v.x;
	x = _x;
	y = _y;
	return *this;
}